

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O0

void __thiscall
QuickConnection::QuickConnection
          (QuickConnection *this,QuickCallback *quick_cb,ProcessThread *thread,UdpSocket *socket,
          uint32_t session_id,string *dst_ip,uint16_t dst_port,bool connected,AckThread *ack_thread)

{
  ProcessThread *pPVar1;
  pointer __p;
  RingBuffer<QuickPacket> *this_00;
  pointer pQVar2;
  QuicConnectionStats *this_01;
  RttStats *this_02;
  QuicUnackedPacketMap *this_03;
  pointer rtt_stats;
  pointer unacked_packets;
  pointer stats;
  SendAlgorithmInterface *__p_00;
  PacingSender *this_04;
  pointer this_05;
  pointer sender;
  unique_ptr<ReceivedPacket,std::default_delete<ReceivedPacket>> *local_88;
  type local_70;
  Location local_68;
  byte local_39;
  string *psStack_38;
  bool connected_local;
  string *dst_ip_local;
  UdpSocket *pUStack_28;
  uint32_t session_id_local;
  UdpSocket *socket_local;
  ProcessThread *thread_local;
  QuickCallback *quick_cb_local;
  QuickConnection *this_local;
  
  local_39 = connected;
  psStack_38 = dst_ip;
  dst_ip_local._4_4_ = session_id;
  pUStack_28 = socket;
  socket_local = (UdpSocket *)thread;
  thread_local = (ProcessThread *)quick_cb;
  quick_cb_local = (QuickCallback *)this;
  dd::Module::Module(&this->super_Module);
  (this->super_Module)._vptr_Module = (_func_int **)&PTR_TimeUntilNextProcess_001c0580;
  this->_session_id = dst_ip_local._4_4_;
  std::__cxx11::string::string((string *)&this->_dst_ip,(string *)psStack_38);
  this->_dst_port = dst_port;
  this->_socket = pUStack_28;
  this->_thread = (ProcessThread *)socket_local;
  dd::RepeatingTaskHandle::RepeatingTaskHandle(&this->_repeating_task);
  this->_ack_thread = ack_thread;
  this->_repeating_task_interval_ms = 0x14;
  this->_server_state = (bool)(local_39 & 1);
  std::unique_ptr<unsigned_char,std::default_delete<unsigned_char>>::
  unique_ptr<std::default_delete<unsigned_char>,void>
            ((unique_ptr<unsigned_char,std::default_delete<unsigned_char>> *)&this->_send_buf);
  std::unique_ptr<quic::SendAlgorithmInterface,std::default_delete<quic::SendAlgorithmInterface>>::
  unique_ptr<std::default_delete<quic::SendAlgorithmInterface>,void>
            ((unique_ptr<quic::SendAlgorithmInterface,std::default_delete<quic::SendAlgorithmInterface>>
              *)&this->_send_algorithm);
  std::unique_ptr<quic::PacingSender,std::default_delete<quic::PacingSender>>::
  unique_ptr<std::default_delete<quic::PacingSender>,void>
            ((unique_ptr<quic::PacingSender,std::default_delete<quic::PacingSender>> *)
             &this->_pacing_sender);
  std::unique_ptr<quic::QuicClock,std::default_delete<quic::QuicClock>>::
  unique_ptr<std::default_delete<quic::QuicClock>,void>
            ((unique_ptr<quic::QuicClock,std::default_delete<quic::QuicClock>> *)&this->_clock);
  std::unique_ptr<quic::RttStats,std::default_delete<quic::RttStats>>::
  unique_ptr<std::default_delete<quic::RttStats>,void>
            ((unique_ptr<quic::RttStats,std::default_delete<quic::RttStats>> *)&this->_rtt_stats);
  std::unique_ptr<quic::QuicConnectionStats,std::default_delete<quic::QuicConnectionStats>>::
  unique_ptr<std::default_delete<quic::QuicConnectionStats>,void>
            ((unique_ptr<quic::QuicConnectionStats,std::default_delete<quic::QuicConnectionStats>> *
             )&this->_connection_stats);
  std::unique_ptr<RingBuffer<QuickPacket>,std::default_delete<RingBuffer<QuickPacket>>>::
  unique_ptr<std::default_delete<RingBuffer<QuickPacket>>,void>
            ((unique_ptr<RingBuffer<QuickPacket>,std::default_delete<RingBuffer<QuickPacket>>> *)
             &this->_wait_send_packets);
  std::unique_ptr<quic::QuicUnackedPacketMap,std::default_delete<quic::QuicUnackedPacketMap>>::
  unique_ptr<std::default_delete<quic::QuicUnackedPacketMap>,void>
            ((unique_ptr<quic::QuicUnackedPacketMap,std::default_delete<quic::QuicUnackedPacketMap>>
              *)&this->_unacked_packet_map);
  this->_sequence_number = 0;
  this->_packet_number = 0;
  std::vector<quic::AckedPacket,_std::allocator<quic::AckedPacket>_>::vector(&this->_packets_acked);
  std::vector<quic::LostPacket,_std::allocator<quic::LostPacket>_>::vector(&this->_packets_lost);
  this->_rtt_updated = false;
  this->_expect_recv_sequence_number = 0;
  local_88 = (unique_ptr<ReceivedPacket,std::default_delete<ReceivedPacket>> *)
             this->_received_packets;
  do {
    std::unique_ptr<ReceivedPacket,std::default_delete<ReceivedPacket>>::
    unique_ptr<std::default_delete<ReceivedPacket>,void>(local_88);
    local_88 = local_88 + 8;
  } while (local_88 !=
           (unique_ptr<ReceivedPacket,std::default_delete<ReceivedPacket>> *)&this->_quick_cb);
  this->_quick_cb = (QuickCallback *)thread_local;
  this->_retransmission_packet_timeout_us = 1000000;
  std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::list
            (&this->_wait_retransmission_packets);
  this->_wait_process_infinite = false;
  this->_total_acked_bytes = 0;
  this->_prior_total_acked_bytes = 0;
  this->_print_acked_bytes_us = 0;
  this->_recv_speed_bytes = 0;
  this->_print_time_ms = 0;
  this->_latest_received_ack_time = 0;
  this->_acked_rate = 0;
  this->_prior_receive_ack_time = 0;
  this->_prior_sent_time = 0;
  this->_need_reconnect = true;
  this->_reconnect_time = 0;
  this->_latest_send_msg_time = 0;
  this->_latest_recv_msg_time = 0;
  std::__cxx11::list<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>::
  list(&this->_send_packets_len);
  this->_total_send_len = 0;
  std::__cxx11::list<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>::
  list(&this->_recv_packets_len);
  this->_total_recv_len = 0;
  std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::list
            (&this->_acked_packets_len);
  std::__cxx11::list<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>::
  list(&this->_real_send_packets_len);
  std::__cxx11::list<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>::
  list(&this->_real_recv_packets_len);
  if ((this->_server_state & 1U) != 0) {
    this->_need_reconnect = false;
  }
  AckThread::AddSession(this->_ack_thread,this->_session_id,&this->_dst_ip,this->_dst_port);
  __p = (pointer)operator_new__(0x800);
  std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::reset(&this->_send_buf,__p);
  if ((this->_server_state & 1U) == 0) {
    ConnectToServer(this);
  }
  this_00 = (RingBuffer<QuickPacket> *)operator_new(0x18);
  RingBuffer<QuickPacket>::RingBuffer(this_00,1000);
  std::unique_ptr<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_>::reset
            (&this->_wait_send_packets,this_00);
  pQVar2 = (pointer)operator_new(0x18);
  pQVar2->_vptr_QuicClock = (_func_int **)0x0;
  *(undefined8 *)&pQVar2->is_calibrated_ = 0;
  (pQVar2->calibration_offset_).time_offset_ = 0;
  quic::QuicClockImpl::QuicClockImpl((QuicClockImpl *)pQVar2);
  std::unique_ptr<quic::QuicClock,_std::default_delete<quic::QuicClock>_>::reset
            (&this->_clock,pQVar2);
  this_01 = (QuicConnectionStats *)operator_new(0x30);
  quic::QuicConnectionStats::QuicConnectionStats(this_01);
  std::unique_ptr<quic::QuicConnectionStats,_std::default_delete<quic::QuicConnectionStats>_>::reset
            (&this->_connection_stats,this_01);
  this_02 = (RttStats *)operator_new(0x60);
  quic::RttStats::RttStats(this_02);
  std::unique_ptr<quic::RttStats,_std::default_delete<quic::RttStats>_>::reset
            (&this->_rtt_stats,this_02);
  this_03 = (QuicUnackedPacketMap *)operator_new(0x2c0020);
  quic::QuicUnackedPacketMap::QuicUnackedPacketMap(this_03);
  std::unique_ptr<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>::
  reset(&this->_unacked_packet_map,this_03);
  pQVar2 = std::unique_ptr<quic::QuicClock,_std::default_delete<quic::QuicClock>_>::get
                     (&this->_clock);
  rtt_stats = std::unique_ptr<quic::RttStats,_std::default_delete<quic::RttStats>_>::get
                        (&this->_rtt_stats);
  unacked_packets =
       std::unique_ptr<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
       ::get(&this->_unacked_packet_map);
  stats = std::
          unique_ptr<quic::QuicConnectionStats,_std::default_delete<quic::QuicConnectionStats>_>::
          get(&this->_connection_stats);
  __p_00 = quic::SendAlgorithmInterface::Create(pQVar2,rtt_stats,unacked_packets,kBBRv2,stats,0x20);
  std::unique_ptr<quic::SendAlgorithmInterface,_std::default_delete<quic::SendAlgorithmInterface>_>
  ::reset(&this->_send_algorithm,__p_00);
  this_04 = (PacingSender *)operator_new(0x40);
  quic::PacingSender::PacingSender(this_04);
  std::unique_ptr<quic::PacingSender,_std::default_delete<quic::PacingSender>_>::reset
            (&this->_pacing_sender,this_04);
  this_05 = std::unique_ptr<quic::PacingSender,_std::default_delete<quic::PacingSender>_>::
            operator->(&this->_pacing_sender);
  sender = std::
           unique_ptr<quic::SendAlgorithmInterface,_std::default_delete<quic::SendAlgorithmInterface>_>
           ::get(&this->_send_algorithm);
  quic::PacingSender::set_sender(this_05,sender);
  pPVar1 = this->_thread;
  dd::Location::Location
            (&local_68,"QuickConnection",
             "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_connection.cc"
             ,0x26);
  (*(pPVar1->super_TaskQueueBase)._vptr_TaskQueueBase[8])(pPVar1,this,&local_68);
  (*(this->_thread->super_TaskQueueBase)._vptr_TaskQueueBase[7])();
  local_70.this = this;
  PostTask<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_boss_li[P]quick_quick_quick_connection_cc:41:11),_nullptr>
            (this,&local_70);
  return;
}

Assistant:

QuickConnection::QuickConnection(QuickCallback* quick_cb, dd::ProcessThread *thread, UdpSocket* socket, 
	uint32_t session_id, const std::string &dst_ip, uint16_t dst_port, bool connected, AckThread* ack_thread)
	: _quick_cb(quick_cb), _thread(thread), _socket(socket), _session_id(session_id), _dst_ip(dst_ip), _dst_port(dst_port), _server_state(connected)
	,_ack_thread(ack_thread)
{
	if (_server_state)
		_need_reconnect = false;
	_ack_thread->AddSession(_session_id, _dst_ip, _dst_port);
	_send_buf.reset(new uint8_t[SEND_BUF_LEN]);
	if (!_server_state)
		ConnectToServer();
	_wait_send_packets.reset(new RingBuffer<QuickPacket>(1000));
	_clock.reset(new quic::QuicClockImpl());
	_connection_stats.reset(new quic::QuicConnectionStats);
	_rtt_stats.reset(new quic::RttStats);
	_unacked_packet_map.reset(new quic::QuicUnackedPacketMap);
	_send_algorithm.reset(quic::SendAlgorithmInterface::Create(_clock.get(),
		_rtt_stats.get(),
		_unacked_packet_map.get(),
		quic::kBBRv2,
		_connection_stats.get(),
		32));

	_pacing_sender.reset(new quic::PacingSender);
	_pacing_sender->set_sender(_send_algorithm.get());

	_thread->RegisterModule(this, dd::RTC_FROM_HERE);
	_thread->WakeUp(this);

	PostTask([this] {
		_repeating_task = dd::RepeatingTaskHandle::DelayedStart(_thread->Current(), _repeating_task_interval_ms, [this] {
			if(!_server_state && _need_reconnect)
				TryReconnectServer();
			TrySendHeartbeat();
			MaybeWakeupProcess();
			PickTimeoutUnackedPackets();
			if (_clock->Now().ToDebuggingValue() - _print_acked_bytes_us >= 1000000) {
				_print_acked_bytes_us = _clock->Now().ToDebuggingValue();
				char buf[256] = { 0 };
				float speed = _total_acked_bytes - _prior_total_acked_bytes;
				speed = speed / 1024.0 / 1024.0;
#ifdef OUTPUT_DEBUG_INFO
				dd::OutputDebugInfo("%llu acked: %f Mbyte/s, acked_rate = %llu\r\n", _print_acked_bytes_us, speed, _acked_rate);
#endif
				_prior_total_acked_bytes = _total_acked_bytes;
			}
			return _repeating_task_interval_ms;
		});
	});
}